

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::AddGuardBlock
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,uint32_t entry_blk_label_id)

{
  pointer puVar1;
  BasicBlock *__ptr;
  uint32_t label_id;
  _func_int **pp_Var2;
  mapped_type *pmVar3;
  undefined4 in_register_00000084;
  InlinePass *this_00;
  string message;
  size_type __dnew;
  key_type local_7c;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_78;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_70;
  undefined1 local_68 [32];
  spv_position_t local_48;
  
  this_00 = (InlinePass *)CONCAT44(in_register_00000084,entry_blk_label_id);
  puVar1 = new_blocks[1].
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)new_blk_ptr;
  local_70._M_head_impl = (BasicBlock *)this;
  label_id = Module::TakeNextIdBound
                       ((Module *)
                        puVar1[6]._M_t.
                        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  if ((label_id == 0) &&
     (puVar1[9]._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0))
  {
    local_48.line = 0x25;
    local_68._0_8_ = local_68 + 0x10;
    local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)&local_48);
    local_68._16_8_ = local_48.line;
    *(undefined8 *)local_68._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_68._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_68._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_68._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)(local_68._0_8_ + 0x1d),"act-ids.",8);
    local_68._8_8_ = local_48.line;
    *(char *)(local_68._0_8_ + local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                *)(puVar1 + 7),SPV_MSG_ERROR,"",&local_48,(char *)local_68._0_8_);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  else if (label_id != 0) {
    AddBranch((InlinePass *)new_blocks,label_id,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)this_00);
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)callee2caller,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)this_00);
    NewLabel((InlinePass *)local_68,(uint32_t)new_blocks);
    pp_Var2 = (_func_int **)operator_new(0x88);
    *pp_Var2 = (_func_int *)0x0;
    pp_Var2[1] = (_func_int *)local_68._0_8_;
    pp_Var2[3] = (_func_int *)&PTR__Instruction_009309d8;
    *(undefined4 *)(pp_Var2 + 9) = 0;
    *(undefined8 *)((long)pp_Var2 + 0x3e) = 0;
    pp_Var2[7] = (_func_int *)0x0;
    pp_Var2[0x10] = (_func_int *)0x0;
    pp_Var2[0xe] = (_func_int *)0x0;
    pp_Var2[0xf] = (_func_int *)0x0;
    pp_Var2[0xc] = (_func_int *)0x0;
    pp_Var2[0xd] = (_func_int *)0x0;
    pp_Var2[10] = (_func_int *)0x0;
    pp_Var2[0xb] = (_func_int *)0x0;
    pp_Var2[4] = (_func_int *)(pp_Var2 + 3);
    pp_Var2[5] = (_func_int *)(pp_Var2 + 3);
    *(undefined1 *)(pp_Var2 + 6) = 1;
    pp_Var2[2] = (_func_int *)&PTR__InstructionList_00930a70;
    __ptr = (BasicBlock *)(this_00->super_Pass)._vptr_Pass;
    (this_00->super_Pass)._vptr_Pass = pp_Var2;
    if (__ptr != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)this_00,__ptr);
    }
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_78,&local_7c);
    *pmVar3 = label_id;
    (this->super_Pass)._vptr_Pass = (this_00->super_Pass)._vptr_Pass;
    this = this_00;
  }
  (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>)
           local_70._M_head_impl;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::AddGuardBlock(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::unordered_map<uint32_t, uint32_t>* callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr, uint32_t entry_blk_label_id) {
  const auto guard_block_id = context()->TakeNextId();
  if (guard_block_id == 0) {
    return nullptr;
  }
  AddBranch(guard_block_id, &new_blk_ptr);
  new_blocks->push_back(std::move(new_blk_ptr));
  // Start the next block.
  new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(guard_block_id));
  // Reset the mapping of the callee's entry block to point to
  // the guard block.  Do this so we can fix up phis later on to
  // satisfy dominance.
  (*callee2caller)[entry_blk_label_id] = guard_block_id;
  return new_blk_ptr;
}